

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O3

void __thiscall
gvr::PointCloud::resizeVertexList(PointCloud *this,int vn,bool with_scanprop,bool with_scanpos)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar2 = vn * 3;
  uVar9 = 0xffffffffffffffff;
  if (-1 < vn) {
    uVar9 = (long)iVar2 << 2;
  }
  pfVar3 = (float *)operator_new__(uVar9);
  iVar5 = this->n;
  if (vn <= this->n) {
    iVar5 = vn;
  }
  uVar1 = iVar5 * 3;
  if (0 < iVar5) {
    pfVar4 = this->vertex;
    iVar5 = uVar1 + 1;
    uVar8 = (ulong)(uVar1 - 1);
    do {
      pfVar3[uVar8] = pfVar4[uVar8];
      iVar5 = iVar5 + -1;
      uVar8 = uVar8 - 1;
    } while (1 < iVar5);
  }
  if (SBORROW4(uVar1,iVar2) != (int)(uVar1 + vn * -3) < 0) {
    memset(pfVar3 + (int)uVar1,0,(ulong)(~uVar1 + iVar2) * 4 + 4);
  }
  if (this->vertex != (float *)0x0) {
    operator_delete__(this->vertex);
  }
  this->vertex = pfVar3;
  if (with_scanprop) {
    pfVar3 = (float *)operator_new__(uVar9);
    iVar5 = this->n;
    iVar7 = vn;
    if (iVar5 < vn) {
      iVar7 = iVar5;
    }
    if (0 < iVar7) {
      pfVar4 = this->scanprop;
      iVar6 = iVar7 * 3 + 1;
      uVar8 = (ulong)(iVar7 * 3 - 1);
      do {
        pfVar3[uVar8] = pfVar4[uVar8];
        iVar6 = iVar6 + -1;
        uVar8 = uVar8 - 1;
      } while (1 < iVar6);
    }
    if (iVar5 < vn) {
      pfVar4 = pfVar3 + (long)iVar5 * 3 + 2;
      iVar5 = vn - iVar5;
      do {
        pfVar4[-2] = 0.0;
        pfVar4[-1] = 0.0;
        *pfVar4 = 1.0;
        pfVar4 = pfVar4 + 3;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  else {
    pfVar3 = (float *)0x0;
  }
  if (this->scanprop != (float *)0x0) {
    operator_delete__(this->scanprop);
  }
  this->scanprop = pfVar3;
  if (with_scanpos) {
    pfVar3 = (float *)operator_new__(uVar9);
    iVar5 = this->n;
    if (vn <= this->n) {
      iVar5 = vn;
    }
    uVar1 = iVar5 * 3;
    if (0 < iVar5) {
      pfVar4 = this->scanpos;
      iVar5 = uVar1 + 1;
      uVar9 = (ulong)(uVar1 - 1);
      do {
        pfVar3[uVar9] = pfVar4[uVar9];
        iVar5 = iVar5 + -1;
        uVar9 = uVar9 - 1;
      } while (1 < iVar5);
    }
    if (SBORROW4(uVar1,iVar2) != (int)(uVar1 + vn * -3) < 0) {
      memset(pfVar3 + (int)uVar1,0,(ulong)(iVar2 + ~uVar1) * 4 + 4);
    }
  }
  else {
    pfVar3 = (float *)0x0;
  }
  if (this->scanpos != (float *)0x0) {
    operator_delete__(this->scanpos);
  }
  this->scanpos = pfVar3;
  this->n = vn;
  return;
}

Assistant:

void PointCloud::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [3*vn];

  for (int i=3*std::min(n, vn)-1; i>=0; i--)
  {
    p[i]=vertex[i];
  }

  for (int i=3*std::min(n, vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] vertex;

  vertex=p;
  p=0;

  if (with_scanprop)
  {
    p=new float [3*vn];

    for (int i=3*std::min(n, vn)-1; i>=0; i--)
    {
      p[i]=scanprop[i];
    }

    for (int i=std::min(n, vn); i<vn; i++)
    {
      p[3*i]=0;
      p[3*i+1]=0;
      p[3*i+2]=1;
    }
  }

  delete [] scanprop;

  scanprop=p;
  p=0;

  if (with_scanpos)
  {
    p=new float [3*vn];

    for (int i=3*std::min(n, vn)-1; i>=0; i--)
    {
      p[i]=scanpos[i];
    }

    for (int i=3*std::min(n, vn); i<3*vn; i++)
    {
      p[i]=0;
    }
  }

  delete [] scanpos;

  scanpos=p;

  n=vn;
}